

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temper.cpp
# Opt level: O3

void applyTemperament(MidiFile *midifile,string *temperament,int base)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)temperament);
  if (iVar1 == 0) {
    applyPythagoreanTemperament(midifile,0);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)temperament);
  if (iVar1 == 0) {
    applyMeantoneTemperament(midifile,0);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)temperament);
  if (iVar1 == 0) {
    applyKirnberger3Temperament(midifile,0);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)temperament);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)temperament);
    if (iVar1 == 0) {
      applyBadTemperament(midifile,0);
      return;
    }
    iVar1 = std::__cxx11::string::compare((char *)temperament);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)temperament);
      if (iVar1 != 0) {
        return;
      }
      applyEqualTemperament(midifile,0);
      return;
    }
    applyWeirdTemperament(midifile,0);
    return;
  }
  applyValottiTemperament(midifile,0);
  return;
}

Assistant:

void applyTemperament(MidiFile& midifile, const string& temperament, int base) {
	if (temperament == "pythagorean") {	
		applyPythagoreanTemperament(midifile);
	} else if (temperament == "meantone") {
		applyMeantoneTemperament(midifile);
	} else if (temperament == "kirnberger3") {
		applyKirnberger3Temperament(midifile);
	} else if (temperament == "valotti") {
		applyValottiTemperament(midifile);
	} else if (temperament == "bad") {
		applyBadTemperament(midifile);
	} else if (temperament == "weird") {
		applyWeirdTemperament(midifile);
	} else if (temperament == "equal") {
		applyEqualTemperament(midifile);
	}
}